

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v9::detail::write<char,fmt::v9::appender>(appender out,char *value)

{
  size_t sVar1;
  appender aVar2;
  
  if (value != (char *)0x0) {
    sVar1 = strlen(value);
    aVar2 = copy_str_noinline<char,char_const*,fmt::v9::appender>(value,value + sVar1,out);
    return (appender)aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  throw_format_error("string pointer is null");
}

Assistant:

FMT_CONSTEXPR_CHAR_TRAITS auto write(OutputIt out, const Char* value)
    -> OutputIt {
  if (!value) {
    throw_format_error("string pointer is null");
  } else {
    out = write(out, basic_string_view<Char>(value));
  }
  return out;
}